

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

BOOL __thiscall Js::RootObjectBase::EnsureProperty(RootObjectBase *this,PropertyId propertyId)

{
  BOOL BVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  BVar1 = HasOwnPropertyCheckNoRedecl(this,propertyId);
  if (BVar1 == 0) {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar2 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1a])
              (this,(ulong)(uint)propertyId,pRVar2,0x30,0);
  }
  return 1;
}

Assistant:

BOOL
    RootObjectBase::EnsureProperty(PropertyId propertyId)
    {
        if (!RootObjectBase::HasOwnPropertyCheckNoRedecl(propertyId))
        {
            this->InitProperty(propertyId, this->GetLibrary()->GetUndefined(),
                static_cast<Js::PropertyOperationFlags>(PropertyOperation_PreInit | PropertyOperation_SpecialValue));
        }
        return true;
    }